

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> * __thiscall
ylt::metric::static_metric_manager<test_id_t<9ul>>::
create_metric_static<ylt::metric::basic_static_counter<long>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
          (static_metric_manager<test_id_t<9UL>_> *this,string *name,string *help,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *args)

{
  byte bVar1;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> *in_RDI;
  bool r;
  shared_ptr<ylt::metric::basic_static_counter<long>_> m;
  pair<std::error_code,_std::nullptr_t> *in_stack_ffffffffffffff18;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>
  *in_stack_ffffffffffffff20;
  error_code *this_00;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> *__x;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<ylt::metric::static_metric> *metric;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  shared_ptr<ylt::metric::static_metric> local_50;
  byte local_39;
  
  __x = in_RDI;
  std::
  make_shared<ylt::metric::basic_static_counter<long>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
            (in_stack_ffffffffffffff58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  metric = &local_50;
  std::shared_ptr<ylt::metric::static_metric>::
  shared_ptr<ylt::metric::basic_static_counter<long>,void>
            ((shared_ptr<ylt::metric::static_metric> *)in_stack_ffffffffffffff20,
             (shared_ptr<ylt::metric::basic_static_counter<long>_> *)in_stack_ffffffffffffff18);
  bVar1 = static_metric_manager<test_id_t<9UL>_>::register_metric
                    ((static_metric_manager<test_id_t<9UL>_> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),metric);
  std::shared_ptr<ylt::metric::static_metric>::~shared_ptr
            ((shared_ptr<ylt::metric::static_metric> *)0x24850c);
  local_39 = bVar1 & 1;
  if (local_39 == 0) {
    std::make_error_code(0);
    std::make_pair<std::error_code,decltype(nullptr)>
              (&in_stack_ffffffffffffff20->first,(void **)in_stack_ffffffffffffff18);
    std::pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>::
    pair<std::error_code,_std::nullptr_t,_true>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18)
    ;
  }
  else {
    this_00 = (error_code *)&stack0xffffffffffffff58;
    std::error_code::error_code(this_00);
    std::make_pair<std::error_code,std::shared_ptr<ylt::metric::basic_static_counter<long>>&>
              (&__x->first,(shared_ptr<ylt::metric::basic_static_counter<long>_> *)this_00);
  }
  std::shared_ptr<ylt::metric::basic_static_counter<long>_>::~shared_ptr
            ((shared_ptr<ylt::metric::basic_static_counter<long>_> *)0x2485ea);
  return in_RDI;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_static(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }